

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim.c
# Opt level: O3

int Pdr_ManSimDataInit(Aig_Man_t *pAig,Vec_Int_t *vCiObjs,Vec_Int_t *vCiVals,Vec_Int_t *vNodes,
                      Vec_Int_t *vCoObjs,Vec_Int_t *vCoVals,Vec_Int_t *vCi2Rem)

{
  uint uVar1;
  uint *puVar2;
  int *piVar3;
  Vec_Ptr_t *pVVar4;
  byte bVar5;
  void *pvVar6;
  Aig_Obj_t *pAVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  
  puVar2 = pAig->pTerSimData;
  iVar10 = pAig->pConst1->Id;
  iVar8 = iVar10 >> 4;
  bVar5 = (char)iVar10 * '\x02';
  puVar2[iVar8] = (puVar2[iVar8] >> (bVar5 & 0x1f) & 3 ^ 2) << (bVar5 & 0x1f) ^ puVar2[iVar8];
  if (0 < vCiObjs->nSize) {
    piVar3 = vCiObjs->pArray;
    pVVar4 = pAig->vObjs;
    lVar9 = 0;
    do {
      if (pVVar4 == (Vec_Ptr_t *)0x0) {
        pvVar6 = (void *)0x0;
      }
      else {
        uVar1 = piVar3[lVar9];
        if (((int)uVar1 < 0) || (pVVar4->nSize <= (int)uVar1)) goto LAB_005fccdf;
        pvVar6 = pVVar4->pArray[uVar1];
      }
      if (vCiVals->nSize <= lVar9) goto LAB_005fccfe;
      iVar10 = *(int *)((long)pvVar6 + 0x24) >> 4;
      bVar5 = (char)*(int *)((long)pvVar6 + 0x24) * '\x02';
      puVar2[iVar10] =
           (puVar2[iVar10] >> (bVar5 & 0x1f) & 3 ^ 2 - (vCiVals->pArray[lVar9] == 0)) <<
           (bVar5 & 0x1f) ^ puVar2[iVar10];
      lVar9 = lVar9 + 1;
    } while (lVar9 < vCiObjs->nSize);
  }
  if ((vCi2Rem != (Vec_Int_t *)0x0) && (0 < vCi2Rem->nSize)) {
    piVar3 = vCi2Rem->pArray;
    pVVar4 = pAig->vObjs;
    lVar9 = 0;
    do {
      iVar10 = piVar3[lVar9];
      if (((long)iVar10 < 0) || (pVVar4->nSize <= iVar10)) goto LAB_005fccdf;
      iVar10 = *(int *)((long)pVVar4->pArray[iVar10] + 0x24);
      iVar8 = iVar10 >> 4;
      bVar5 = (char)iVar10 * '\x02';
      puVar2[iVar8] = (~(puVar2[iVar8] >> (bVar5 & 0x1f)) & 3) << (bVar5 & 0x1f) ^ puVar2[iVar8];
      lVar9 = lVar9 + 1;
    } while (lVar9 < vCi2Rem->nSize);
  }
  if (0 < vNodes->nSize) {
    lVar9 = 0;
    do {
      pVVar4 = pAig->vObjs;
      if (pVVar4 == (Vec_Ptr_t *)0x0) {
        pAVar7 = (Aig_Obj_t *)0x0;
      }
      else {
        uVar1 = vNodes->pArray[lVar9];
        if (((int)uVar1 < 0) || (pVVar4->nSize <= (int)uVar1)) goto LAB_005fccdf;
        pAVar7 = (Aig_Obj_t *)pVVar4->pArray[uVar1];
      }
      Pdr_ManExtendOneEval(pAig,pAVar7);
      lVar9 = lVar9 + 1;
    } while (lVar9 < vNodes->nSize);
  }
  if (0 < vCoObjs->nSize) {
    lVar9 = 0;
    do {
      pVVar4 = pAig->vObjs;
      if (pVVar4 == (Vec_Ptr_t *)0x0) {
        pAVar7 = (Aig_Obj_t *)0x0;
      }
      else {
        uVar1 = vCoObjs->pArray[lVar9];
        if (((int)uVar1 < 0) || (pVVar4->nSize <= (int)uVar1)) goto LAB_005fccdf;
        pAVar7 = (Aig_Obj_t *)pVVar4->pArray[uVar1];
      }
      Pdr_ManExtendOneEval(pAig,pAVar7);
      lVar9 = lVar9 + 1;
      iVar10 = vCoObjs->nSize;
    } while (lVar9 < iVar10);
    if (0 < iVar10) {
      lVar9 = 0;
      do {
        iVar8 = vCoObjs->pArray[lVar9];
        if (((long)iVar8 < 0) || (pAig->vObjs->nSize <= iVar8)) {
LAB_005fccdf:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if (vCoVals->nSize <= lVar9) {
LAB_005fccfe:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar8 = *(int *)((long)pAig->vObjs->pArray[iVar8] + 0x24);
        if ((pAig->pTerSimData[iVar8 >> 4] >> ((char)iVar8 * '\x02' & 0x1fU) & 3) !=
            2 - (vCoVals->pArray[lVar9] == 0)) {
          return 0;
        }
        lVar9 = lVar9 + 1;
      } while (iVar10 != lVar9);
    }
  }
  return 1;
}

Assistant:

int Pdr_ManSimDataInit( Aig_Man_t * pAig,
    Vec_Int_t * vCiObjs, Vec_Int_t * vCiVals, Vec_Int_t * vNodes,
    Vec_Int_t * vCoObjs, Vec_Int_t * vCoVals, Vec_Int_t * vCi2Rem )
{
    Aig_Obj_t * pObj;
    int i;
    // set the CI values
    Pdr_ManSimInfoSet( pAig, Aig_ManConst1(pAig), PDR_ONE );
    Aig_ManForEachObjVec( vCiObjs, pAig, pObj, i )
        Pdr_ManSimInfoSet( pAig, pObj, (Vec_IntEntry(vCiVals, i)?PDR_ONE:PDR_ZER) );
    // set the FOs to remove
    if ( vCi2Rem != NULL )
    Aig_ManForEachObjVec( vCi2Rem, pAig, pObj, i )
        Pdr_ManSimInfoSet( pAig, pObj, PDR_UND );
    // perform ternary simulation
    Aig_ManForEachObjVec( vNodes, pAig, pObj, i )
        Pdr_ManExtendOneEval( pAig, pObj );
    // transfer results to the output
    Aig_ManForEachObjVec( vCoObjs, pAig, pObj, i )
        Pdr_ManExtendOneEval( pAig, pObj );
    // check the results
    Aig_ManForEachObjVec( vCoObjs, pAig, pObj, i )
        if ( Pdr_ManSimInfoGet( pAig, pObj ) != (Vec_IntEntry(vCoVals, i)?PDR_ONE:PDR_ZER) )
            return 0;
    return 1;
}